

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCascade.c
# Opt level: O2

int Abc_ResCheckNonStrict(char *Pattern,int nVars,int nBits)

{
  char cVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int nPats;
  ulong uVar8;
  int nPats_00;
  ulong uVar9;
  ulong uVar10;
  
  bVar2 = (char)nBits - 1U & 0x1f;
  iVar6 = 1 << bVar2;
  bVar3 = (byte)nVars & 0x1f;
  iVar7 = 0 << bVar2;
  uVar8 = 0;
  if (0 < 1 << bVar3) {
    uVar8 = (ulong)(uint)(1 << bVar3);
  }
  if (nVars < 1) {
    nVars = iVar7;
  }
  iVar4 = 0 << bVar3;
  do {
    if (iVar7 == nVars) {
      return iVar4;
    }
    nPats = 0;
    nPats_00 = 0;
    for (uVar9 = 0; uVar10 = uVar8, uVar8 != uVar9; uVar9 = uVar9 + 1) {
      cVar1 = Pattern[uVar9];
      uVar10 = uVar9;
      if ((1 << ((byte)iVar7 & 0x1f) & (uint)uVar9) == 0) {
        iVar5 = Abc_ResCheckUnique(Abc_ResCheckNonStrict::Pat0,nPats,(int)cVar1);
        if (iVar5 != 0) {
          Abc_ResCheckNonStrict::Pat0[nPats] = cVar1;
          if (iVar6 <= nPats) break;
          nPats = nPats + 1;
        }
      }
      else {
        iVar5 = Abc_ResCheckUnique(Abc_ResCheckNonStrict::Pat1,nPats_00,(int)cVar1);
        if (iVar5 != 0) {
          Abc_ResCheckNonStrict::Pat1[nPats_00] = cVar1;
          if (iVar6 <= nPats_00) break;
          nPats_00 = nPats_00 + 1;
        }
      }
    }
    iVar4 = iVar4 + (uint)((uint)uVar10 == 1 << bVar3);
    iVar7 = iVar7 + 1;
  } while( true );
}

Assistant:

int Abc_ResCheckNonStrict( char Pattern[], int nVars, int nBits )
{
    static char Pat0[256], Pat1[256];
    int v, m, nPats0, nPats1, nNumber = (1 << (nBits - 1));
    int Result = 0;
    for ( v = 0; v < nVars; v++ )
    {
        nPats0 = nPats1 = 0;
        for ( m = 0; m < (1<<nVars); m++ )
        {
            if ( (m & (1 << v)) == 0 )
            {
                if ( Abc_ResCheckUnique( Pat0, nPats0, Pattern[m] ) )
                {
                    Pat0[ nPats0++ ] = Pattern[m];
                    if ( nPats0 > nNumber )
                        break;
                }
            }
            else
            {
                if ( Abc_ResCheckUnique( Pat1, nPats1, Pattern[m] ) )
                {
                    Pat1[ nPats1++ ] = Pattern[m];
                    if ( nPats1 > nNumber )
                        break;
                }
            }
        }
        if ( m == (1<<nVars) )
            Result++;
    }
    return Result;
}